

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall
CVmImageLoader::load_mres(CVmImageLoader *this,ulong siz,CVmImageLoaderMres *res_ifc)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  char buf [16];
  char name_buf [256];
  uint local_158;
  uint local_154;
  byte local_150;
  long local_148;
  CVmImageLoaderMres *local_140;
  byte local_138 [264];
  
  local_140 = res_ifc;
  iVar4 = (*this->fp_->_vptr_CVmImageFile[8])();
  if (1 < siz) {
    lVar1 = this->base_seek_ofs_;
    uVar6 = siz - 2;
    (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_158,2);
    uVar5 = local_158 & 0xffff;
    if (uVar5 != 0) {
      uVar9 = 0;
      local_148 = CONCAT44(extraout_var,iVar4) + lVar1;
      do {
        if (uVar6 < 9) goto LAB_00262d83;
        uVar7 = uVar6 - 9;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_158,9);
        uVar3 = local_154;
        uVar2 = local_158;
        uVar8 = (ulong)local_150;
        uVar6 = uVar7 - uVar8;
        if (uVar7 < uVar8) goto LAB_00262d83;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_138,uVar8);
        local_138[uVar8] = 0;
        if (uVar8 != 0) {
          uVar7 = 0;
          do {
            local_138[uVar7] = ~local_138[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        (*local_140->_vptr_CVmImageLoaderMres[2])
                  (local_140,(ulong)(uVar2 + (int)local_148),(ulong)uVar3,local_138,uVar8);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar5);
    }
    if (uVar6 != 0) {
      (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,uVar6);
    }
    return;
  }
LAB_00262d83:
  err_throw(0x132);
}

Assistant:

void CVmImageLoader::load_mres(ulong siz, CVmImageLoaderMres *res_ifc)
{
    char buf[16];
    uint entry_cnt;
    long base_ofs;
    uint i;

    /* 
     *   Note the current physical seek position - each entry's seek position
     *   is stored in the table of contents as an offset from this location.
     *   
     *   Compute the physical base offset: this is the logical base offset in
     *   our image stream, plus the offset of the image stream within the
     *   image file.  We need the physical base offset because the underlying
     *   interpreter's resource loader works with the physical file, not the
     *   logical image stream.  
     */
    base_ofs = fp_->get_seek() + base_seek_ofs_;
    
    /* read the entry count and size of the table of contents */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        uint32_t entry_ofs;
        uint32_t entry_size;
        uint entry_name_len;
        char name_buf[256];
        char *p;
        size_t rem;

        /* read the fixed part of the table-of-contents entry */
        read_data(buf, 9, &siz);
        entry_ofs = t3rp4u(buf);
        entry_size = t3rp4u(buf + 4);
        entry_name_len = (uchar)*(buf + 8);

        /* read the name */
        read_data(name_buf, entry_name_len, &siz);

        /* null-terminate the name */
        name_buf[entry_name_len] = '\0';

        /* XOR the bytes of the name with 0xFF */
        for (p = name_buf, rem = entry_name_len ; rem != 0 ; ++p, --rem)
             *p ^= 0xFF;

        /* add the resource to the resource interface */
        res_ifc->add_resource(base_ofs + entry_ofs, entry_size,
                              name_buf, entry_name_len);
    }

    /* 
     *   skip the data portion of the block, since we now have a map of
     *   the data and can load individual resources on demand 
     */
    if (siz != 0)
        fp_->skip_ahead(siz);
}